

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O2

IPAddress * jaegertracing::net::IPAddress::v4(IPAddress *__return_storage_ptr__,string *hostPort)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  pStack_38;
  
  parse(&pStack_38,hostPort);
  v4(__return_storage_ptr__,&pStack_38.first,pStack_38.second);
  std::__cxx11::string::~string((string *)&pStack_38);
  return __return_storage_ptr__;
}

Assistant:

static IPAddress v4(const std::string& hostPort)
    {
        auto result = parse(hostPort);
        return v4(result.first, result.second);
    }